

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set.cc
# Opt level: O0

void __thiscall
google::protobuf::UnknownFieldSet::AddFixed64(UnknownFieldSet *this,int number,uint64 value)

{
  vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *in_RDX;
  uint32 in_ESI;
  UnknownField field;
  uint32 in_stack_ffffffffffffffdc;
  
  UnknownField::SetType((UnknownField *)&stack0xffffffffffffffd8,TYPE_FIXED64);
  std::vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>::
  push_back(in_RDX,(value_type *)CONCAT44(in_stack_ffffffffffffffdc,in_ESI));
  return;
}

Assistant:

void UnknownFieldSet::AddFixed64(int number, uint64 value) {
  UnknownField field;
  field.number_ = number;
  field.SetType(UnknownField::TYPE_FIXED64);
  field.data_.fixed64_ = value;
  fields_.push_back(field);
}